

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_change_event_add_hton_u32_Test::~Buffer_change_event_add_hton_u32_Test
          (Buffer_change_event_add_hton_u32_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, change_event_add_hton_u32) {
    BufferWithReadonlyStrings local;
    auto constexpr addme = uint32_t { 128 };
    auto constexpr size = sizeof(addme);
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = size,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_hton_u32(&local.buf, addme));
    EXPECT_EQ(changes_t{expected}, local.changes);
}